

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test(void)

{
  istream *piVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  char c;
  int dist;
  int b;
  int a;
  int e;
  int n;
  
  freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt","r",_stdin);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(piVar1,&e);
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    piVar1 = std::operator>>((istream *)&std::cin,&c);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&a);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&b);
    std::istream::operator>>(piVar1,&dist);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,b);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dist);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void test() {
    int a, b, dist;
    int n, e;
    char c;
    freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt", "r", stdin);
    cin >> n >> e;
    for (int i = 0; i < 100; i++) {
        cin >> c >> a >> b >> dist;
        cout << a << " " << b << " " << dist << endl;
    }

}